

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::setLevelSetVisibleQuantity
          (VolumeMeshVertexScalarQuantity *this,string *name)

{
  VolumeMesh *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ShaderProgram *program;
  Engine *pEVar1;
  Engine *this_02;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  iterator iVar4;
  VolumeMeshVertexScalarQuantity *this_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_109;
  string local_108;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::VolumeMeshQuantity,_std::default_delete<polyscope::VolumeMeshQuantity>_>_>_>_>
                  *)&(((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                       super_QuantityS<polyscope::VolumeMesh>.parent)->
                     super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.field_0x3c0,
                 name);
  if (iVar4._M_node !=
      (_Base_ptr)
      &(((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
         super_QuantityS<polyscope::VolumeMesh>.parent)->
       super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.field_0x3c8) {
    if (*(long *)(iVar4._M_node + 2) == 0) {
      this_03 = (VolumeMeshVertexScalarQuantity *)0x0;
    }
    else {
      this_03 = (VolumeMeshVertexScalarQuantity *)
                __dynamic_cast(*(long *)(iVar4._M_node + 2),&VolumeMeshQuantity::typeinfo,&typeinfo,
                               0);
    }
    pEVar1 = render::engine;
    if (this_03 != (VolumeMeshVertexScalarQuantity *)0x0) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"SLICE_TETS","");
      this_02 = render::engine;
      VolumeMesh::getMaterial_abi_cxx11_
                (&local_50,
                 (this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                 super_QuantityS<polyscope::VolumeMesh>.parent);
      this_00 = (this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                super_QuantityS<polyscope::VolumeMesh>.parent;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"SLICE_TETS_PROPAGATE_VALUE","");
      __l._M_len = 1;
      __l._M_array = &local_d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b0,__l,&local_109);
      ScalarQuantity<polyscope::VolumeMeshScalarQuantity>::addScalarRules
                (&local_98,
                 &(this->super_VolumeMeshScalarQuantity).
                  super_ScalarQuantity<polyscope::VolumeMeshScalarQuantity>,&local_b0);
      VolumeMesh::addVolumeMeshRules(&local_80,this_00,&local_98,true,true);
      render::Engine::addMaterialRules(&local_68,this_02,&local_50,&local_80);
      (*pEVar1->_vptr_Engine[0x2b])(&local_e8,pEVar1,&local_108,&local_68,0);
      p_Var3 = p_Stack_e0;
      peVar2 = local_e8;
      local_e8 = (element_type *)0x0;
      p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = (this->levelSetProgram).
                super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->levelSetProgram).
      super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      (this->levelSetProgram).
      super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var3;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      VolumeMesh::fillSliceGeometryBuffers
                ((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                 super_QuantityS<polyscope::VolumeMesh>.parent,
                 (this->levelSetProgram).
                 super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      fillSliceColorBuffers
                (this_03,(this->levelSetProgram).
                         super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      pEVar1 = render::engine;
      program = (this->levelSetProgram).
                super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      VolumeMesh::getMaterial_abi_cxx11_
                (&local_108,
                 (this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
                 super_QuantityS<polyscope::VolumeMesh>.parent);
      render::Engine::setMaterial(pEVar1,program,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      fillLevelSetData(this,(this->levelSetProgram).
                            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
      setLevelSetUniforms(this,(this->levelSetProgram).
                               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      this->showQuantity = this_03;
    }
  }
  return;
}

Assistant:

void VolumeMeshVertexScalarQuantity::setLevelSetVisibleQuantity(std::string name) {
  auto pair = parent.quantities.find(name);
  if (pair == parent.quantities.end()) {
    return;
  }
  VolumeMeshQuantity* vmq = pair->second.get();
  VolumeMeshVertexScalarQuantity* q = dynamic_cast<VolumeMeshVertexScalarQuantity*>(vmq);
  if (q == nullptr) {
    return;
  }

  // clang-format off
  levelSetProgram = render::engine->requestShader("SLICE_TETS", 
      render::engine->addMaterialRules(parent.getMaterial(),
        parent.addVolumeMeshRules(
          addScalarRules(
            {"SLICE_TETS_PROPAGATE_VALUE"}), 
        true, true)
      )
    );
  // clang-format on

  // Fill color buffers
  parent.fillSliceGeometryBuffers(*levelSetProgram);
  q->fillSliceColorBuffers(*levelSetProgram);
  render::engine->setMaterial(*levelSetProgram, parent.getMaterial());
  fillLevelSetData(*levelSetProgram);
  setLevelSetUniforms(*levelSetProgram);
  showQuantity = q;
}